

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalKdevelopGenerator::CreateProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *projectname,
          string *executable,string *cmakeFilePattern,string *fileToOpen)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  uint uVar4;
  Directory d;
  string sessionFilename;
  string filename;
  string nextFile;
  string tmp;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Blacklist);
  std::operator+(&filename,outputDir,"/");
  std::operator+(&sessionFilename,projectname,".kdevelop");
  std::__cxx11::string::append((string *)&filename);
  std::__cxx11::string::~string((string *)&sessionFilename);
  std::operator+(&sessionFilename,outputDir,"/");
  std::operator+(&nextFile,projectname,".kdevses");
  std::__cxx11::string::append((string *)&sessionFilename);
  std::__cxx11::string::~string((string *)&nextFile);
  bVar1 = cmsys::SystemTools::FileExists(filename._M_dataplus._M_p);
  if (bVar1) {
    MergeProjectFiles(this,outputDir,projectDir,&filename,executable,cmakeFilePattern,fileToOpen,
                      &sessionFilename);
  }
  else {
    cmsys::Directory::Directory(&d);
    bVar1 = cmsys::Directory::Load(&d,projectDir);
    if (bVar1) {
      uVar2 = cmsys::Directory::GetNumberOfFiles(&d);
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        pcVar3 = cmsys::Directory::GetFile(&d,(ulong)uVar4);
        std::__cxx11::string::string((string *)&nextFile,pcVar3,(allocator *)&tmp);
        bVar1 = std::operator!=(&nextFile,".");
        if (bVar1) {
          bVar1 = std::operator!=(&nextFile,"..");
          if (bVar1) {
            std::__cxx11::string::string((string *)&tmp,(string *)projectDir);
            std::__cxx11::string::append((char *)&tmp);
            std::__cxx11::string::append((string *)&tmp);
            bVar1 = cmsys::SystemTools::FileIsDirectory(&tmp);
            if (bVar1) {
              std::__cxx11::string::append((char *)&tmp);
              bVar1 = std::operator==(&nextFile,"CMakeFiles");
              if (!bVar1) {
                bVar1 = cmsys::SystemTools::FileExists(tmp._M_dataplus._M_p);
                if (!bVar1) goto LAB_0040893d;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->Blacklist,&nextFile);
            }
LAB_0040893d:
            std::__cxx11::string::~string((string *)&tmp);
          }
        }
        std::__cxx11::string::~string((string *)&nextFile);
      }
    }
    CreateNewProjectFile
              (this,outputDir,projectDir,&filename,executable,cmakeFilePattern,fileToOpen,
               &sessionFilename);
    cmsys::Directory::~Directory(&d);
  }
  std::__cxx11::string::~string((string *)&sessionFilename);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::CreateProjectFile(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& projectname, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen)
{
  this->Blacklist.clear();

  std::string filename = outputDir + "/";
  filename += projectname + ".kdevelop";
  std::string sessionFilename = outputDir + "/";
  sessionFilename += projectname + ".kdevses";

  if (cmSystemTools::FileExists(filename.c_str())) {
    this->MergeProjectFiles(outputDir, projectDir, filename, executable,
                            cmakeFilePattern, fileToOpen, sessionFilename);
  } else {
    // add all subdirectories which are cmake build directories to the
    // kdevelop blacklist so they are not monitored for added or removed files
    // since this is handled by adding files to the cmake files
    cmsys::Directory d;
    if (d.Load(projectDir)) {
      size_t numf = d.GetNumberOfFiles();
      for (unsigned int i = 0; i < numf; i++) {
        std::string nextFile = d.GetFile(i);
        if ((nextFile != ".") && (nextFile != "..")) {
          std::string tmp = projectDir;
          tmp += "/";
          tmp += nextFile;
          if (cmSystemTools::FileIsDirectory(tmp)) {
            tmp += "/CMakeCache.txt";
            if ((nextFile == "CMakeFiles") ||
                (cmSystemTools::FileExists(tmp.c_str()))) {
              this->Blacklist.push_back(nextFile);
            }
          }
        }
      }
    }
    this->CreateNewProjectFile(outputDir, projectDir, filename, executable,
                               cmakeFilePattern, fileToOpen, sessionFilename);
  }
}